

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O1

double __thiscall NJamSpell::TLangModel::Score(TLangModel *this,wstring *str)

{
  TWord *pTVar1;
  double dVar2;
  size_t sVar3;
  vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *s;
  undefined1 auVar4 [8];
  TWord *w;
  TWord *__args;
  undefined1 local_70 [8];
  TSentences sentences;
  TWords words;
  
  TTokenizer::Process((TSentences *)local_70,&this->Tokenizer,str);
  sentences.
  super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_70 !=
      (undefined1  [8])
      sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar4 = local_70;
    do {
      pTVar1 = (((pointer)auVar4)->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (__args = (((pointer)auVar4)->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_start; __args != pTVar1; __args = __args + 1) {
        if (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
          _M_realloc_insert<NJamSpell::TWord_const&>
                    ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)
                     &sentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(iterator)0x0,__args);
        }
        else {
          sVar3 = __args->Len;
          (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
           super__Vector_impl_data._M_start)->Ptr = __args->Ptr;
          (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
           super__Vector_impl_data._M_start)->Len = sVar3;
          words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
          super__Vector_impl_data._M_start =
               words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
               .super__Vector_impl_data._M_start + 1;
        }
      }
      auVar4 = (undefined1  [8])((long)auVar4 + 0x18);
    } while (auVar4 != (undefined1  [8])
                       sentences.
                       super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  dVar2 = Score(this,(TWords *)
                     &sentences.
                      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sentences.
      super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(sentences.
                    super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)local_70);
  return dVar2;
}

Assistant:

double TLangModel::Score(const std::wstring& str) const {
    TSentences sentences = Tokenizer.Process(str);
    TWords words;
    for (auto&& s: sentences) {
        for (auto&& w: s) {
            words.push_back(w);
        }
    }
    return Score(words);
}